

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_AnnotateDespiteUnrelatedMultipleUses_Test::
~PrinterTest_AnnotateDespiteUnrelatedMultipleUses_Test
          (PrinterTest_AnnotateDespiteUnrelatedMultipleUses_Test *this)

{
  PrinterTest::~PrinterTest(&this->super_PrinterTest);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, AnnotateDespiteUnrelatedMultipleUses) {
  FakeAnnotationCollector collector;
  {
    Printer printer(output(), '$', &collector);
    printer.Print("012$foo$4$foo$$bar$\n", "foo", "3", "bar", "5");

    FakeDescriptor descriptor{{"path"}, {33}};
    printer.Annotate("bar", "bar", &descriptor);
  }

  EXPECT_EQ(written(), "0123435\n");
  EXPECT_THAT(collector.Get(),
              ElementsAre(Annotation(6, 7, "path", ElementsAre(33))));
}